

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O3

char * uloc_getISO3Language_63(char *localeID)

{
  ushort uVar1;
  char *pcVar2;
  UErrorCode err;
  char lang [12];
  UErrorCode local_20;
  char local_1c [12];
  
  local_20 = U_ZERO_ERROR;
  if (localeID == (char *)0x0) {
    localeID = locale_get_default_63();
  }
  uloc_getLanguage_63(localeID,local_1c,0xc,&local_20);
  pcVar2 = "";
  if (local_20 < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = _findIndex(LANGUAGES,local_1c);
    if (-1 < (short)uVar1) {
      pcVar2 = LANGUAGES_3[uVar1];
    }
  }
  return pcVar2;
}

Assistant:

U_CAPI const char*  U_EXPORT2
uloc_getISO3Language(const char* localeID)
{
    int16_t offset;
    char lang[ULOC_LANG_CAPACITY];
    UErrorCode err = U_ZERO_ERROR;

    if (localeID == NULL)
    {
        localeID = uloc_getDefault();
    }
    uloc_getLanguage(localeID, lang, ULOC_LANG_CAPACITY, &err);
    if (U_FAILURE(err))
        return "";
    offset = _findIndex(LANGUAGES, lang);
    if (offset < 0)
        return "";
    return LANGUAGES_3[offset];
}